

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O1

unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_> __thiscall
IRT::CLabelStatement::CastCopy(CLabelStatement *this)

{
  _func_int **pp_Var1;
  long in_RSI;
  undefined1 *local_40;
  long local_38;
  undefined1 local_30 [16];
  
  pp_Var1 = (_func_int **)operator_new(0x28);
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,*(long *)(in_RSI + 8),
             *(long *)(in_RSI + 0x10) + *(long *)(in_RSI + 8));
  *pp_Var1 = (_func_int *)&PTR_Accept_001830d0;
  pp_Var1[1] = (_func_int *)(pp_Var1 + 3);
  std::__cxx11::string::_M_construct<char*>((string *)(pp_Var1 + 1),local_40,local_40 + local_38);
  (this->super_CStatement).super_IStatement.super_INode._vptr_INode = pp_Var1;
  if (local_40 != local_30) {
    operator_delete(local_40);
  }
  return (__uniq_ptr_data<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>,_true,_true>
          )(__uniq_ptr_data<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<const CLabelStatement> CLabelStatement::CastCopy( ) const {
    return std::move( std::unique_ptr<const CLabelStatement>( new CLabelStatement( label )));
}